

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

int serial_find_by_fd(void *av,void *bv)

{
  Serial *b;
  int a;
  void *bv_local;
  void *av_local;
  
  if (*av < *(int *)((long)bv + 0x10)) {
    av_local._4_4_ = -1;
  }
  else if (*(int *)((long)bv + 0x10) < *av) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int serial_find_by_fd(void *av, void *bv)
{
    int a = *(int *)av;
    Serial *b = (Serial *)bv;

    if (a < b->fd)
        return -1;
    else if (a > b->fd)
        return +1;
    return 0;
}